

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateTopKLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  int iVar1;
  long lVar2;
  bool bVar3;
  Result *pRVar4;
  Type *pTVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  TopKLayerParams *pTVar8;
  Type *pTVar9;
  long lVar10;
  _Rb_tree_header *p_Var11;
  string err;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,2);
  pRVar4 = Result::operator=(&r,(Result *)&err);
  bVar3 = Result::good(pRVar4);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  if (bVar3) {
    validateOutputCount((Result *)&err,layer,2,2);
    pRVar4 = Result::operator=(&r,(Result *)&err);
    bVar3 = Result::good(pRVar4);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_50,"TopK",(allocator *)&local_b0);
      this_00 = &this->blobNameToRank;
      validateInputOutputRankEquality((Result *)&err,layer,&local_50,this_00);
      pRVar4 = Result::operator=(&r,(Result *)&err);
      bVar3 = Result::good(pRVar4);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar3) {
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&(layer->input_).super_RepeatedPtrFieldBase,0);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,pTVar5);
        p_Var11 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar6._M_node == p_Var11) {
LAB_00256e9b:
          if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
            pTVar8 = Specification::NeuralNetworkLayer::topk(layer);
            pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                               (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
            lVar10 = (long)(int)pTVar9->rank_;
            lVar2 = pTVar8->axis_;
            if (SBORROW8(lVar2,-lVar10) != lVar2 + lVar10 < 0 || lVar10 <= lVar2) {
              std::operator+(&local_b0,
                             "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                             ,(layer->name_).ptr_);
              std::operator+(&err,&local_b0,"\' layer.");
              std::__cxx11::string::~string((string *)&local_b0);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
              goto LAB_00256fe9;
            }
          }
          Result::Result(__return_storage_ptr__);
        }
        else {
          pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(layer->output_).super_RepeatedPtrFieldBase,1);
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find(&this_00->_M_t,pTVar5);
          if ((_Rb_tree_header *)iVar6._M_node == p_Var11) goto LAB_00256e9b;
          pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(layer->input_).super_RepeatedPtrFieldBase,0);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_00,pTVar5);
          iVar1 = *pmVar7;
          pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(layer->output_).super_RepeatedPtrFieldBase,1);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_00,pTVar5);
          if (iVar1 == *pmVar7) goto LAB_00256e9b;
          err._M_dataplus._M_p = (pointer)&err.field_2;
          err._M_string_length = 0;
          err.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string((string *)&local_90,(string *)(layer->name_).ptr_);
          std::operator+(&local_70,"Layer \'",&local_90);
          std::operator+(&local_b0,&local_70,
                         "\' of type \'TopK\' expects equal ranks for its input and second output, but they are not equal."
                        );
          std::__cxx11::string::operator=((string *)&err,(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_00256fe9:
          std::__cxx11::string::~string((string *)&err);
        }
        goto LAB_00256eed;
      }
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_00256eed:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateTopKLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 2)).good()) return r;
    if (!(r = validateOutputCount(layer, 2, 2)).good()) return r;
    if (!(r = validateInputOutputRankEquality(layer, "TopK", blobNameToRank)).good()) return r;

    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
        blobNameToRank.find(layer.output(1)) != blobNameToRank.end()) {
        if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.output(1))) {
            std::string err;
            err = "Layer '" + std::string(layer.name()) + "' of type 'TopK' expects equal ranks for its input and second output, but they are not equal.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.topk();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}